

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O2

void __thiscall cppforth::Forth::createFile(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  char cVar1;
  uint src;
  uint uVar2;
  _Ios_Openmode _Var3;
  basic_fstream<char,_std::char_traits<char>_> *__p;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> f;
  string filename;
  ForthFile createdFile;
  
  requireDStackDepth(this,3,"CREATE-FILE");
  this_00 = &this->dStack;
  src = ForthStack<unsigned_int>::getTop(this_00,2);
  uVar2 = ForthStack<unsigned_int>::getTop(this_00,1);
  _Var3 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  filename._M_string_length = 0;
  filename.field_2._M_local_buf[0] = '\0';
  moveFromDataSpace(this,&filename,src,(ulong)uVar2);
  __p = (basic_fstream<char,_std::char_traits<char>_> *)operator_new(0x210);
  std::fstream::fstream(__p,(string *)&filename,_Var3 | _S_trunc);
  std::__shared_ptr<std::fstream,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<std::fstream,void>
            ((__shared_ptr<std::fstream,(__gnu_cxx::_Lock_policy)2> *)&f,__p);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    ForthStack<unsigned_int>::setTop(this_00,1,0);
    ForthStack<unsigned_int>::setTop(this_00,0xffffffc1);
  }
  else {
    createdFile.FILE = this->fileHandle + 1;
    this->fileHandle = createdFile.FILE;
    createdFile.fileAccessMode = _Var3;
    std::__cxx11::string::string((string *)&createdFile.fileName,&filename);
    std::__shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&createdFile.fileObject.
                    super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ,&f.
                     super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  );
    std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>::push_back
              (&this->OpenFiles,&createdFile);
    ForthStack<unsigned_int>::setTop(this_00,1,this->fileHandle);
    ForthStack<unsigned_int>::setTop(this_00,0);
    ForthFile::~ForthFile(&createdFile);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&f.
              super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string((string *)&filename);
  return;
}

Assistant:

void createFile() {
	REQUIRE_DSTACK_DEPTH(3, "CREATE-FILE");

	auto caddr = dStack.getTop(2);
	auto length = SIZE_T(dStack.getTop(1));
	auto fam = static_cast<std::ios_base::openmode>(dStack.getTop()); pop();

	std::string filename{};
	moveFromDataSpace(filename, caddr, length);
	try{
		std::shared_ptr<std::fstream> f{ new std::fstream(filename, fam | std::ios_base::trunc) };
		if (f->is_open()) {
			//auto filesize = std::filesystem::file_size(filename);
			ForthFile createdFile{ ++fileHandle, fam,  filename, f };
			OpenFiles.push_back(createdFile);
			dStack.setTop(1, fileHandle);
			dStack.setTop(0);
		}
		else {
			dStack.setTop(1, 0);
			dStack.setTop(Cell(errorCreateFile));
		}
	}
	catch (std::exception &) {
		dStack.setTop(1, 0);
		dStack.setTop(Cell(errorCreateFile));
	}
}